

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManCnfAddStatic(sat_solver2 *pSat,Vec_Int_t *vCnf0,Vec_Int_t *vCnf1,int *Lits,int iLitOut,
                        int ProofId)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int i;
  Vec_Int_t *p;
  int ClaLits [6];
  
  uVar2 = 0;
  do {
    if (uVar2 == 2) {
      return;
    }
    p = vCnf1;
    if (uVar2 == 0) {
      p = vCnf0;
    }
    for (i = 0; i < p->nSize; i = i + 1) {
      iVar1 = Vec_IntEntry(p,i);
      lVar3 = 0;
      iVar4 = 1;
      while( true ) {
        ClaLits[0] = uVar2 ^ iLitOut;
        if (lVar3 == 10) break;
        switch(iVar1 >> ((byte)lVar3 & 0x1f) & 3) {
        case 0:
          goto switchD_0047ef4e_caseD_0;
        case 1:
          uVar5 = *(uint *)((long)Lits + lVar3 * 2);
          break;
        case 2:
          uVar5 = *(uint *)((long)Lits + lVar3 * 2) ^ 1;
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                        ,0x2c5,
                        "void Ga2_ManCnfAddStatic(sat_solver2 *, Vec_Int_t *, Vec_Int_t *, int *, int, int)"
                       );
        }
        ClaLits[iVar4] = uVar5;
        iVar4 = iVar4 + 1;
switchD_0047ef4e_caseD_0:
        lVar3 = lVar3 + 2;
      }
      sat_solver2_addclause(pSat,ClaLits,ClaLits + iVar4,ProofId);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void Ga2_ManCnfAddStatic( sat_solver2 * pSat, Vec_Int_t * vCnf0, Vec_Int_t * vCnf1, int Lits[], int iLitOut, int ProofId )
{
    Vec_Int_t * vCnf;
    int i, k, b, Cube, Literal, nClaLits, ClaLits[6];
    for ( i = 0; i < 2; i++ )
    {
        vCnf = i ? vCnf1 : vCnf0;
        Vec_IntForEachEntry( vCnf, Cube, k )
        {
            nClaLits = 0;
            ClaLits[nClaLits++] = i ? lit_neg(iLitOut) : iLitOut;
            for ( b = 0; b < 5; b++ )
            {
                Literal = 3 & (Cube >> (b << 1));
                if ( Literal == 1 ) // value 0 --> add positive literal
                {
//                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = Lits[b];
                }
                else if ( Literal == 2 ) // value 1 --> add negative literal
                {
//                    assert( Lits[b] > 1 );
                    ClaLits[nClaLits++] = lit_neg(Lits[b]);
                }
                else if ( Literal != 0 )
                    assert( 0 );
            }
            sat_solver2_addclause( pSat, ClaLits, ClaLits+nClaLits, ProofId );
        }
    }
}